

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_game.cc
# Opt level: O3

HanabiMove __thiscall
hanabi_learning_env::HanabiGame::PickRandomChance
          (HanabiGame *this,
          pair<std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>,_std::vector<double,_std::allocator<double>_>_>
          *chance_outcomes)

{
  HanabiMove HVar1;
  result_type rVar2;
  discrete_distribution<unsigned_long> dist;
  param_type local_48;
  
  std::discrete_distribution<unsigned_long>::param_type::
  param_type<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
            (&local_48,
             (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
             (chance_outcomes->second).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
             (chance_outcomes->second).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish);
  rVar2 = std::discrete_distribution<unsigned_long>::operator()
                    ((discrete_distribution<unsigned_long> *)&local_48,&this->rng_,&local_48);
  HVar1 = (chance_outcomes->first).
          super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
          ._M_impl.super__Vector_impl_data._M_start[rVar2];
  if (local_48._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return HVar1;
}

Assistant:

HanabiMove HanabiGame::PickRandomChance(
    const std::pair<std::vector<HanabiMove>, std::vector<double>>&
        chance_outcomes) const {
  std::discrete_distribution<std::mt19937::result_type> dist(
      chance_outcomes.second.begin(), chance_outcomes.second.end());
  return chance_outcomes.first[dist(rng_)];
}